

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cc
# Opt level: O3

string * google::protobuf::compiler::StripProto(string *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  ulong uVar2;
  undefined1 *puVar3;
  int iVar4;
  size_type sVar5;
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  pcVar1 = (filename->_M_dataplus)._M_p;
  uVar2 = filename->_M_string_length;
  if ((long)uVar2 < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(uVar2,"string length exceeds max size");
LAB_0022ba85:
    if (*(long *)(pcVar1 + (uVar2 - 8)) == 0x6c657665646f746f &&
        *(long *)(pcVar1 + (uVar2 - 0xb)) == 0x65646f746f72702e) {
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,".protodevel","");
      pcVar1 = (filename->_M_dataplus)._M_p;
      uVar2 = filename->_M_string_length;
      if ((long)uVar2 < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (uVar2,"string length exceeds max size");
      }
      puVar3 = local_50;
      if ((long)local_48 < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (local_48,"string length exceeds max size");
      }
      if (uVar2 < local_48) {
        sVar5 = filename->_M_string_length;
      }
      else {
        iVar4 = bcmp(pcVar1 + (uVar2 - local_48),puVar3,local_48);
        sVar5 = filename->_M_string_length;
        if (iVar4 == 0) {
          std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename);
          goto LAB_0022bb33;
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = (filename->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar5);
      goto LAB_0022bb33;
    }
  }
  else if (10 < uVar2) goto LAB_0022ba85;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,".proto","");
  pcVar1 = (filename->_M_dataplus)._M_p;
  uVar2 = filename->_M_string_length;
  if ((long)uVar2 < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(uVar2,"string length exceeds max size");
  }
  puVar3 = local_50;
  if ((long)local_48 < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(local_48,"string length exceeds max size")
    ;
  }
  if (uVar2 < local_48) {
    sVar5 = filename->_M_string_length;
  }
  else {
    iVar4 = bcmp(pcVar1 + (uVar2 - local_48),puVar3,local_48);
    sVar5 = filename->_M_string_length;
    if (iVar4 == 0) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename);
      goto LAB_0022bb33;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar5);
LAB_0022bb33:
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StripProto(const std::string& filename) {
  if (HasSuffixString(filename, ".protodevel")) {
    return StripSuffixString(filename, ".protodevel");
  } else {
    return StripSuffixString(filename, ".proto");
  }
}